

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>,_true>
 __thiscall
duckdb::
make_uniq_base<duckdb::PhysicalResultCollector,duckdb::PhysicalArrowCollector,duckdb::PreparedStatementData&,bool,unsigned_long&>
          (duckdb *this,PreparedStatementData *args,bool *args_1,unsigned_long *args_2)

{
  PhysicalArrowCollector *this_00;
  
  this_00 = (PhysicalArrowCollector *)operator_new(0x140);
  PhysicalArrowCollector::PhysicalArrowCollector(this_00,args,*args_1,*args_2);
  *(PhysicalArrowCollector **)this = this_00;
  return (unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
          )(unique_ptr<duckdb::PhysicalResultCollector,_std::default_delete<duckdb::PhysicalResultCollector>_>
            )this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}